

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O0

ValueCallback * __thiscall
SNMPAgent::addReadWriteStringHandler
          (SNMPAgent *this,char *oid,char **value,size_t max_len,bool isSettable,
          bool overwritePrefix)

{
  SortableOIDType *oid_00;
  StringCallback *this_00;
  SortableOIDType *oidType;
  bool overwritePrefix_local;
  bool isSettable_local;
  size_t max_len_local;
  char **value_local;
  char *oid_local;
  SNMPAgent *this_local;
  
  if ((value == (char **)0x0) || (*value == (char *)0x0)) {
    this_local = (SNMPAgent *)0x0;
  }
  else {
    oid_00 = buildOIDWithPrefix(this,oid,overwritePrefix);
    if (oid_00 == (SortableOIDType *)0x0) {
      this_local = (SNMPAgent *)0x0;
    }
    else {
      this_00 = (StringCallback *)operator_new(0x28);
      StringCallback::StringCallback(this_00,oid_00,value,max_len);
      this_local = (SNMPAgent *)addHandler(this,(ValueCallback *)this_00,isSettable);
    }
  }
  return (ValueCallback *)this_local;
}

Assistant:

ValueCallback* SNMPAgent::addReadWriteStringHandler(const char *oid, char** value, size_t max_len, bool isSettable, bool overwritePrefix){
    if(!value || !*value) return nullptr;

    SortableOIDType* oidType = buildOIDWithPrefix(oid, overwritePrefix);
    if(!oidType) return nullptr;
    return addHandler(new StringCallback(oidType, value, max_len), isSettable);
}